

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  element_type *peVar1;
  ostream *this;
  shared_ptr<IMessageHolder> local_e0;
  string local_d0 [32];
  shared_ptr<MessageHolder> local_b0;
  undefined1 local_a0 [8];
  shared_ptr<IMessageHolder> message;
  shared_ptr<Whale> local_80 [2];
  shared_ptr<Cow> local_60;
  undefined1 local_50 [8];
  shared_ptr<ISpeak> messenger;
  CLI params;
  char **argv_local;
  int argc_local;
  
  CLI::CLI((CLI *)&messenger.super___shared_ptr<ISpeak,_(__gnu_cxx::_Lock_policy)2>._M_refcount,argc
           ,argv);
  std::shared_ptr<ISpeak>::shared_ptr((shared_ptr<ISpeak> *)local_50);
  if (params._24_4_ == 0) {
    std::make_shared<Cow>();
    std::shared_ptr<ISpeak>::operator=((shared_ptr<ISpeak> *)local_50,&local_60);
    std::shared_ptr<Cow>::~shared_ptr(&local_60);
  }
  else if (params._24_4_ == 1) {
    std::make_shared<Whale>();
    std::shared_ptr<ISpeak>::operator=((shared_ptr<ISpeak> *)local_50,local_80);
    std::shared_ptr<Whale>::~shared_ptr(local_80);
  }
  else {
    std::make_shared<DefaultMessenger>();
    std::shared_ptr<ISpeak>::operator=
              ((shared_ptr<ISpeak> *)local_50,
               (shared_ptr<DefaultMessenger> *)
               &message.super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::shared_ptr<DefaultMessenger>::~shared_ptr
              ((shared_ptr<DefaultMessenger> *)
               &message.super___shared_ptr<IMessageHolder,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::make_shared<MessageHolder,std::__cxx11::string&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0);
  std::shared_ptr<IMessageHolder>::shared_ptr<MessageHolder,void>
            ((shared_ptr<IMessageHolder> *)local_a0,&local_b0);
  std::shared_ptr<MessageHolder>::~shared_ptr(&local_b0);
  peVar1 = std::__shared_ptr_access<ISpeak,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<ISpeak,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      local_50);
  std::shared_ptr<IMessageHolder>::shared_ptr(&local_e0,(shared_ptr<IMessageHolder> *)local_a0);
  (**peVar1->_vptr_ISpeak)(local_d0,peVar1,&local_e0);
  this = std::operator<<((ostream *)&std::cout,local_d0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_d0);
  std::shared_ptr<IMessageHolder>::~shared_ptr(&local_e0);
  std::shared_ptr<IMessageHolder>::~shared_ptr((shared_ptr<IMessageHolder> *)local_a0);
  std::shared_ptr<ISpeak>::~shared_ptr((shared_ptr<ISpeak> *)local_50);
  CLI::~CLI((CLI *)&messenger.super___shared_ptr<ISpeak,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
    // Parse cli parameters
    CLI params(argc, argv);

    // Populate messenger dependency
    std::shared_ptr<ISpeak> messenger;
    switch(params.speaker)
    {
    case Animal::Cow:
        messenger = make_shared<Cow>();
        break;
    case Animal::Whale:
        messenger = make_shared<Whale>();
        break;
    default:
        messenger = make_shared<DefaultMessenger>();
    }

	// Populate message dependency
    shared_ptr<IMessageHolder> message = make_shared<MessageHolder>(params.message);

    // Do Stuff
    cout << messenger->Say(message) << endl;
}